

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
          (string *__return_storage_ptr__,void *this,char *extension)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 0x50));
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::to_string(&sStack_38,*(unsigned_long *)((long)this + 0x80));
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ConvertBackslashToSlash(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryWriterSpec::GetModuleFilename(const char* extension) {
  std::string result = module_filename_noext_;
  result += '.';
  result += std::to_string(num_modules_);
  result += extension;
  ConvertBackslashToSlash(&result);
  return result;
}